

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZCompMesh *mesh,
          TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *copy)

{
  TPZGaussRule *pTVar1;
  int iVar2;
  long lVar3;
  
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl = &PTR__TPZSavable_01943050;
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (&this->super_TPZMultiphysicsElement,&PTR_PTR_01940440,mesh,
             &copy->super_TPZMultiphysicsElement);
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl =
       &PTR__TPZMultiphysicsCompEl_01940130;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore = (TPZCompElSide *)0x0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019444a0;
  lVar3 = 0xa0;
  do {
    *(undefined8 *)
     ((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.fExtAlloc + lVar3 + -0x68) = 0;
    *(undefined4 *)
     ((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.fExtAlloc + lVar3 + -0x60) =
         0xffffffff;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0xf0);
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore = (this->fElementVec).fExtAlloc;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  TPZVec<long>::TPZVec(&this->fConnectIndexes,&copy->fConnectIndexes);
  (this->fIntRule).super_TPZIntPoints._vptr_TPZIntPoints = (_func_int **)&PTR__TPZIntPoints_0181c260
  ;
  iVar2 = (copy->fIntRule).fOrdEta;
  (this->fIntRule).fOrdKsi = (copy->fIntRule).fOrdKsi;
  (this->fIntRule).fOrdEta = iVar2;
  (this->fIntRule).fOrdZeta = (copy->fIntRule).fOrdZeta;
  pTVar1 = (copy->fIntRule).fIntEta;
  (this->fIntRule).fIntKsi = (copy->fIntRule).fIntKsi;
  (this->fIntRule).fIntEta = pTVar1;
  (this->fIntRule).fIntZeta = (copy->fIntRule).fIntZeta;
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl(TPZCompMesh &mesh, const TPZMultiphysicsCompEl<TGeometry> &copy) : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(mesh,copy),
fConnectIndexes(copy.fConnectIndexes),  fIntRule(copy.fIntRule)
{
#ifdef PZDEBUG
    TPZMaterial * material = Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
#endif
    
}